

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkatom.c
# Opt level: O1

DLword compute_lisp_hash(char *char_base,DLword offset,DLword length,DLword fatp)

{
  ushort uVar1;
  char *pcVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  undefined6 in_register_00000012;
  ulong uVar6;
  
  iVar4 = (int)CONCAT62(in_register_00000012,length);
  if (iVar4 == 0) {
    return 0;
  }
  uVar6 = (ulong)offset;
  if (fatp == 0) {
    uVar1 = (ushort)*(byte *)((ulong)(char_base + uVar6) ^ 3) << 8;
    if (length != 1) {
      uVar5 = iVar4 - 1;
      pcVar2 = char_base + uVar6;
      do {
        pcVar2 = pcVar2 + 1;
        uVar1 = (ushort)*(byte *)((ulong)pcVar2 ^ 3) + (uVar1 + (uVar1 & 0xfff) * 4) * 0x101;
        uVar3 = (short)uVar5 - 1;
        uVar5 = (uint)uVar3;
      } while (uVar3 != 0);
    }
  }
  else {
    uVar1 = *(short *)((ulong)(char_base + uVar6 * 2) ^ 2) << 8;
    if (length != 1) {
      pcVar2 = char_base + uVar6 * 2;
      uVar5 = iVar4 - 1;
      do {
        pcVar2 = pcVar2 + 2;
        uVar1 = (ushort)*(byte *)((ulong)pcVar2 ^ 2) + (uVar1 + (uVar1 & 0xfff) * 4) * 0x101;
        uVar3 = (short)uVar5 - 1;
        uVar5 = (uint)uVar3;
      } while (uVar3 != 0);
    }
  }
  return uVar1;
}

Assistant:

DLword compute_lisp_hash(const char *char_base, DLword offset, DLword length, DLword fatp) {
  DLword hash;
  DLword number;
  DLword temp1;
  const DLword *word_base;

  if (length == 0) return (0);

  if (fatp) { /* fat characters in the string to be searched. */
    word_base = (const DLword *)char_base;
    word_base += offset;
    hash = (DLword)((0xFF & GETWORD(word_base)) << 8); /* get first byte */
    word_base++;                                     /* skip length area */

    for (number = 1; number <= length - 1; word_base++, number++) {
      hash = (hash + ((hash & 4095) << 2)) & 0x0ffff;
      temp1 = (hash + ((hash & 255) << 8)) & 0x0ffff;
      hash = (temp1 + (0xFF & GETWORD(word_base))) & 0x0ffff;
    }
  } else {
    char_base += offset;
    hash = (DLword)((0xFF & GETBYTE(char_base)) << 8); /* get first byte */
    char_base++;                                  /* skip length area */

    for (number = 1; number <= length - 1; char_base++, number++) {
      hash = (hash + ((hash & 4095) << 2)) & 0x0ffff;
      temp1 = (hash + ((hash & 255) << 8)) & 0x0ffff;
      hash = (temp1 + (0xFF & GETBYTE(char_base))) & 0x0ffff;
    }
  }
  return (hash);

}